

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O3

bool __thiscall
HighsTimer::reportOnTolerance
          (HighsTimer *this,char *grep_stamp,vector<int,_std::allocator<int>_> *clock_list,
          double ideal_sum_time,double tolerance_percent_report)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  double dVar7;
  size_t in_RCX;
  int iVar8;
  long lVar9;
  undefined1 uVar10;
  long lVar11;
  ulong uVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> percent_sum_clock_times;
  allocator_type local_89;
  char *local_88;
  double local_80;
  pointer local_78;
  double local_70;
  double local_68;
  double local_60;
  ulong local_58;
  pointer local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  piVar3 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = 0;
  local_88 = grep_stamp;
  local_80 = ideal_sum_time;
  local_60 = tolerance_percent_report;
  read(this,0,clock_list,in_RCX);
  if (piVar4 != piVar3) {
    local_68 = (double)((long)piVar4 - (long)piVar3 >> 2);
    lVar9 = (long)local_68 + (ulong)(local_68 == 0.0);
    iVar8 = 0;
    dVar13 = 0.0;
    lVar11 = 0;
    local_78 = piVar3;
    local_70 = extraout_XMM0_Qa;
    local_50 = piVar4;
    do {
      uVar1 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      if ((this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar1] <= 0.0) {
        printf("Clock %d - %s - still running\n",(ulong)uVar1,
               (this->clock_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]._M_dataplus._M_p);
      }
      dVar7 = local_68;
      iVar8 = iVar8 + (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar1];
      dVar13 = dVar13 + (this->clock_time).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
    uVar10 = 0;
    if ((iVar8 != 0) && (0.0 <= dVar13)) {
      std::vector<double,_std::allocator<double>_>::vector(&local_48,(size_type)local_68,&local_89);
      piVar4 = local_50;
      piVar3 = local_78;
      dVar15 = 0.0;
      if (local_50 != local_78) {
        piVar5 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = 0;
        do {
          dVar14 = (pdVar6[piVar5[lVar9]] * 100.0) / dVar13;
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = dVar14;
          if (dVar15 <= dVar14) {
            dVar15 = dVar14;
          }
          lVar9 = lVar9 + 1;
        } while ((long)dVar7 + (ulong)(dVar7 == 0.0) != lVar9);
      }
      uVar12 = (ulong)(local_60 <= dVar15);
      if (local_60 <= dVar15) {
        local_58 = (ulong)(local_60 <= dVar15);
        printf("\n%s-time  Operation                       :    Time     ( Total",local_88);
        if (0.0 < local_80) {
          printf(";  Ideal");
        }
        puts(";  Local):    Calls  Time/Call");
        dVar13 = 0.0;
        if (piVar4 != piVar3) {
          lVar9 = 0;
          do {
            iVar8 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
            dVar15 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar8];
            iVar2 = (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar8];
            if ((0 < iVar2) &&
               ((local_60 <= 0.0 ||
                (local_60 <=
                 local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9])))) {
              local_78 = (pointer)(dVar15 * 100.0);
              local_68 = dVar13;
              printf("%s-time  %-32s: %11.4e (%5.1f%%",dVar15,(dVar15 * 100.0) / local_70,local_88,
                     (this->clock_names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_dataplus._M_p);
              if (0.0 < local_80) {
                printf("; %5.1f%%",(double)local_78 / local_80);
              }
              printf("; %5.1f%%):%9ld %11.4e\n",
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9],dVar15 / (double)iVar2,
                     (long)(this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar8]);
              dVar13 = local_68;
            }
            dVar13 = dVar13 + dVar15;
            lVar9 = lVar9 + 1;
          } while ((long)dVar7 + (ulong)(dVar7 == 0.0) != lVar9);
        }
        printf("%s-time  SUM                             : %11.4e (%5.1f%%",dVar13,
               (dVar13 * 100.0) / local_70,local_88);
        if (0.0 < local_80) {
          printf("; %5.1f%%",(dVar13 * 100.0) / local_80);
        }
        printf("; %5.1f%%)\n",0x4059000000000000);
        printf("%s-time  TOTAL                           : %11.4e\n",local_70,local_88);
        uVar12 = local_58;
      }
      uVar10 = (undefined1)uVar12;
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return (bool)uVar10;
}

Assistant:

bool reportOnTolerance(
      const char*
          grep_stamp,  //!< Character string used to extract output using grep
      std::vector<HighsInt>& clock_list,  //!< List of indices to report
      double ideal_sum_time = 0,          //!< Ideal value for times to sum to
      double tolerance_percent_report =
          0  //!< Lower bound on percentage of total time
             //!< before an individual clock is reported
  ) {
    size_t num_clock_list_entries = clock_list.size();
    double current_run_highs_time = read();
    bool non_null_report = false;

    // Check validity of the clock list and check no clocks are still
    // running, determine whether there are any times to report and
    // determine the total clock times
    HighsInt sum_calls = 0;
    double sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      assert(iClock >= 0);
      assert(iClock < num_clock);
      // Check that the clock's not still running. It should be set to
      // getWallTime() >= 0 (or initialised to initial_clock_start > 0)
      const bool clock_stopped = clock_start[iClock] > 0;
      if (!clock_stopped) {
        printf("Clock %d - %s - still running\n", int(iClock),
               clock_names[iClock].c_str());
      }
      assert(clock_stopped);
      sum_calls += clock_num_call[iClock];
      sum_clock_times += clock_time[iClock];
    }
    if (!sum_calls) return non_null_report;
    if (sum_clock_times < 0) return non_null_report;

    std::vector<double> percent_sum_clock_times(num_clock_list_entries);
    double max_percent_sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      percent_sum_clock_times[i] = 100.0 * clock_time[iClock] / sum_clock_times;
      max_percent_sum_clock_times =
          std::max(percent_sum_clock_times[i], max_percent_sum_clock_times);
    }
    if (max_percent_sum_clock_times < tolerance_percent_report)
      return non_null_report;

    non_null_report = true;

    // Report one line per clock, the time, number of calls and time per call
    printf("\n%s-time  Operation                       :    Time     ( Total",
           grep_stamp);
    if (ideal_sum_time > 0) printf(";  Ideal");
    printf(";  Local):    Calls  Time/Call\n");
    // Convert approximate seconds
    double sum_time = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      double time = clock_time[iClock];
      double percent_run_highs = 100.0 * time / current_run_highs_time;
      double time_per_call = 0;
      if (clock_num_call[iClock] > 0) {
        time_per_call = time / clock_num_call[iClock];
        const bool report_time =
            tolerance_percent_report > 0
                ? percent_sum_clock_times[i] >= tolerance_percent_report
                : clock_num_call[iClock] > 0;
        if (report_time) {
          printf("%s-time  %-32s: %11.4e (%5.1f%%", grep_stamp,
                 clock_names[iClock].c_str(), time, percent_run_highs);
          if (ideal_sum_time > 0) {
            double percent_ideal = 100.0 * time / ideal_sum_time;
            printf("; %5.1f%%", percent_ideal);
          }
          printf("; %5.1f%%):%9ld %11.4e\n", percent_sum_clock_times[i],
                 static_cast<long int>(clock_num_call[iClock]), time_per_call);
        }
      }
      sum_time += time;
    }
    double percent_sum_clock_times_all = 100.0;
    assert(sum_time == sum_clock_times);
    double percent_run_highs = 100.0 * sum_time / current_run_highs_time;
    printf("%s-time  SUM                             : %11.4e (%5.1f%%",
           grep_stamp, sum_time, percent_run_highs);
    if (ideal_sum_time > 0) {
      double percent_ideal = 100.0 * sum_time / ideal_sum_time;
      printf("; %5.1f%%", percent_ideal);
    }
    printf("; %5.1f%%)\n", percent_sum_clock_times_all);
    printf("%s-time  TOTAL                           : %11.4e\n", grep_stamp,
           current_run_highs_time);
    return non_null_report;
  }